

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O0

void __thiscall
amrex::MultiCutFab::define
          (MultiCutFab *this,BoxArray *ba,DistributionMapping *dm,int ncomp,int ngrow,
          FabArray<amrex::EBCellFlagFab> *cellflags)

{
  undefined4 in_ECX;
  char *in_RSI;
  MultiCutFab *in_RDI;
  undefined4 in_R8D;
  FabArray<amrex::EBCellFlagFab> *in_R9;
  undefined8 *puVar1;
  DistributionMapping *in_stack_ffffffffffffff90;
  BoxArray *in_stack_ffffffffffffff98;
  FabFactory<amrex::CutFab> this_00;
  undefined8 local_58;
  FabFactory<amrex::CutFab> *a_factory;
  
  local_58 = 0;
  a_factory = (FabFactory<amrex::CutFab> *)0x0;
  puVar1 = &local_58;
  MFInfo::MFInfo((MFInfo *)0x117c418);
  this_00._vptr_FabFactory = (_func_int **)0x0;
  DefaultFabFactory<amrex::CutFab>::DefaultFabFactory
            ((DefaultFabFactory<amrex::CutFab> *)&stack0xffffffffffffffa0);
  FabArray<amrex::CutFab>::define
            ((FabArray<amrex::CutFab> *)this_00._vptr_FabFactory,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,(int)((ulong)puVar1 >> 0x20),(int)puVar1,
             (MFInfo *)CONCAT44(in_R8D,in_ECX),a_factory);
  in_RDI->m_cellflags = in_R9;
  DefaultFabFactory<amrex::CutFab>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::CutFab> *)0x117c47d);
  MFInfo::~MFInfo((MFInfo *)0x117c487);
  remove(in_RDI,in_RSI);
  return;
}

Assistant:

void
MultiCutFab::define (const BoxArray& ba, const DistributionMapping& dm,
                     int ncomp, int ngrow, const FabArray<EBCellFlagFab>& cellflags)
{
    m_data.define(ba,dm,ncomp,ngrow,MFInfo(),DefaultFabFactory<CutFab>()),
    m_cellflags = &cellflags;
    remove();
}